

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall QSqlField::detach(QSqlField *this)

{
  QSqlFieldPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QSqlFieldPrivate *)0x0) &&
     ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1)) {
    QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper(&this->d);
    return;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }